

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  float text_baseline_y;
  ImGuiNextWindowDataFlags IVar1;
  ImGuiWindow *this;
  ImVec2 pos;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ImGuiID id;
  ImU32 IVar7;
  ImU32 col;
  ImGuiContext *g;
  ImDrawFlags IVar8;
  uint flags_00;
  uint uVar9;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar10;
  float fVar11;
  float fVar12;
  bool hovered;
  ImRect bb;
  bool held;
  ImRect total_bb;
  bool local_cd;
  float local_cc;
  ImRect local_c8;
  uint local_b4;
  bool local_ad;
  ImGuiID local_ac;
  undefined1 local_a8 [16];
  float local_98;
  ImGuiNextWindowDataFlags local_94;
  char *local_90;
  ImVec2 local_88;
  char *local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  ImVec2 local_50;
  ImVec2 local_48;
  ImRect local_40;
  
  pIVar3 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  IVar1 = (pIVar3->NextWindowData).Flags;
  (pIVar3->NextWindowData).Flags = 0;
  if (this->SkipItems == false) {
    local_90 = preview_value;
    id = ImGuiWindow::GetID(this,label,(char *)0x0);
    if ((~flags & 0x60U) == 0) {
      __assert_fail("(flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                    ,0x61f,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
    }
    local_cc = 0.0;
    if ((flags & 0x20U) == 0) {
      local_cc = GetFrameHeight();
    }
    IVar2 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_78._8_4_ = extraout_XMM0_Dc;
    local_78._0_4_ = IVar2.x;
    local_78._4_4_ = IVar2.y;
    local_78._12_4_ = extraout_XMM0_Dd;
    fVar12 = IVar2.x;
    fVar10 = IVar2.y;
    local_98 = local_cc;
    if ((flags & 0x40U) == 0) {
      local_98 = CalcItemWidth();
      fVar12 = (float)local_78._0_4_;
      fVar10 = (float)local_78._4_4_;
    }
    text_baseline_y = (pIVar3->Style).FramePadding.y;
    local_c8.Max.x = (this->DC).CursorPos.x + local_98;
    fVar10 = text_baseline_y + text_baseline_y + fVar10 + (this->DC).CursorPos.y;
    local_c8.Max.y = fVar10;
    local_c8.Min = (this->DC).CursorPos;
    fVar11 = 0.0;
    if (0.0 < fVar12) {
      fVar11 = (pIVar3->Style).ItemInnerSpacing.x + fVar12;
    }
    local_40.Max.y = fVar10 + 0.0;
    local_40.Max.x = fVar11 + local_c8.Max.x;
    local_b4 = flags;
    local_94 = IVar1;
    local_80 = label;
    local_40.Min = local_c8.Min;
    ItemSize(&local_40,text_baseline_y);
    bVar4 = ItemAdd(&local_40,id,&local_c8,0);
    if (!bVar4) {
      return false;
    }
    bVar5 = ButtonBehavior(&local_c8,id,&local_cd,&local_ad,0);
    local_ac = ImHashStr("##ComboPopup",0,id);
    bVar6 = IsPopupOpen(local_ac,0);
    flags_00 = local_b4;
    bVar4 = bVar6;
    if (!bVar5) {
      bVar4 = bVar6 || pIVar3->NavActivateId != id;
    }
    if (bVar4 == false) {
      OpenPopupEx(local_ac,0);
      bVar6 = true;
    }
    IVar7 = GetColorU32(local_cd + 7,1.0);
    local_a8 = ZEXT416((uint)local_c8.Min.x);
    local_68 = ZEXT416((uint)local_c8.Max.x);
    RenderNavHighlight(&local_c8,id,1);
    uVar9 = -(uint)((float)local_68._0_4_ - local_cc <= (float)local_a8._0_4_);
    local_a8._0_4_ = uVar9 & local_a8._0_4_ | ~uVar9 & (uint)((float)local_68._0_4_ - local_cc);
    local_a8._4_4_ = local_68._4_4_ & local_a8._4_4_;
    local_a8._8_4_ = local_68._8_4_ & local_a8._8_4_;
    local_a8._12_4_ = local_68._12_4_ & local_a8._12_4_;
    if ((flags_00 & 0x40) == 0) {
      local_88.y = local_c8.Max.y;
      local_88.x = (float)local_a8._0_4_;
      IVar8 = 0xf0;
      if ((flags_00 & 0x20) == 0) {
        IVar8 = 0x50;
      }
      ImDrawList::AddRectFilled
                (this->DrawList,&local_c8.Min,&local_88,IVar7,(pIVar3->Style).FrameRounding,IVar8);
    }
    if ((flags_00 & 0x20) == 0) {
      IVar7 = GetColorU32(((byte)(local_cd | bVar6) & 1) + 0x15,1.0);
      col = GetColorU32(0,1.0);
      flags_00 = local_b4;
      local_88.y = local_c8.Min.y;
      local_88.x = (float)local_a8._0_4_;
      IVar8 = 0xa0;
      if (local_98 <= local_cc) {
        IVar8 = 0xf0;
      }
      ImDrawList::AddRectFilled
                (this->DrawList,&local_88,&local_c8.Max,IVar7,(pIVar3->Style).FrameRounding,IVar8);
      if ((local_cc + (float)local_a8._0_4_) - (pIVar3->Style).FramePadding.x <= local_c8.Max.x) {
        fVar12 = (pIVar3->Style).FramePadding.y;
        IVar2.y = fVar12 + local_c8.Min.y;
        IVar2.x = (float)local_a8._0_4_ + fVar12;
        RenderArrow(this->DrawList,IVar2,col,3,1.0);
      }
    }
    RenderFrameBorder(local_c8.Min,local_c8.Max,(pIVar3->Style).FrameRounding);
    if (local_90 != (char *)0x0 && (char)((flags_00 & 0x40) >> 6) == '\0') {
      if (pIVar3->LogEnabled == true) {
        LogSetNextTextDecoration("{","}");
      }
      local_88.y = local_c8.Min.y + (pIVar3->Style).FramePadding.y;
      local_88.x = local_c8.Min.x + (pIVar3->Style).FramePadding.x;
      local_48.x = (float)local_a8._0_4_;
      local_48.y = local_c8.Max.y;
      local_50.x = 0.0;
      local_50.y = 0.0;
      RenderTextClipped(&local_88,&local_48,local_90,(char *)0x0,(ImVec2 *)0x0,&local_50,
                        (ImRect *)0x0);
    }
    if (0.0 < (float)local_78._0_4_) {
      pos.y = local_c8.Min.y + (pIVar3->Style).FramePadding.y;
      pos.x = local_c8.Max.x + (pIVar3->Style).ItemInnerSpacing.x;
      RenderText(pos,local_80,(char *)0x0,true);
    }
    if (bVar6 != false) {
      (pIVar3->NextWindowData).Flags = local_94;
      bVar4 = BeginComboPopup(local_ac,&local_c8,flags_00);
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    ImGuiNextWindowDataFlags backup_next_window_data_flags = g.NextWindowData.Flags;
    g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : CalcItemWidth();
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y * 2.0f));
    const ImRect total_bb(bb.Min, bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &bb))
        return false;

    // Open on click
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);
    const ImGuiID popup_id = ImHashStr("##ComboPopup", 0, id);
    bool popup_open = IsPopupOpen(popup_id, ImGuiPopupFlags_None);
    if ((pressed || g.NavActivateId == id) && !popup_open)
    {
        OpenPopupEx(popup_id, ImGuiPopupFlags_None);
        popup_open = true;
    }

    // Render shape
    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    const float value_x2 = ImMax(bb.Min.x, bb.Max.x - arrow_size);
    RenderNavHighlight(bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(bb.Min, ImVec2(value_x2, bb.Max.y), frame_col, style.FrameRounding, (flags & ImGuiComboFlags_NoArrowButton) ? ImDrawFlags_RoundCornersAll : ImDrawFlags_RoundCornersLeft);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        ImU32 bg_col = GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
        ImU32 text_col = GetColorU32(ImGuiCol_Text);
        window->DrawList->AddRectFilled(ImVec2(value_x2, bb.Min.y), bb.Max, bg_col, style.FrameRounding, (w <= arrow_size) ? ImDrawFlags_RoundCornersAll : ImDrawFlags_RoundCornersRight);
        if (value_x2 + arrow_size - style.FramePadding.x <= bb.Max.x)
            RenderArrow(window->DrawList, ImVec2(value_x2 + style.FramePadding.y, bb.Min.y + style.FramePadding.y), text_col, ImGuiDir_Down, 1.0f);
    }
    RenderFrameBorder(bb.Min, bb.Max, style.FrameRounding);

    // Render preview and label
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
    {
        if (g.LogEnabled)
            LogSetNextTextDecoration("{", "}");
        RenderTextClipped(bb.Min + style.FramePadding, ImVec2(value_x2, bb.Max.y), preview_value, NULL, NULL);
    }
    if (label_size.x > 0)
        RenderText(ImVec2(bb.Max.x + style.ItemInnerSpacing.x, bb.Min.y + style.FramePadding.y), label);

    if (!popup_open)
        return false;

    g.NextWindowData.Flags = backup_next_window_data_flags;
    return BeginComboPopup(popup_id, bb, flags);
}